

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O2

int metaAddChild(lua_State *L)

{
  Idx<Variable> *this;
  value_type *__x;
  Variable *pVVar1;
  
  this = (Idx<Variable> *)(*lua_touserdata)(L,1);
  __x = (value_type *)(*lua_touserdata)(L,2);
  pVVar1 = Idx<Variable>::operator->(this);
  std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back(&pVVar1->children,__x);
  return 0;
}

Assistant:

int metaAddChild(lua_State* L)
{
	auto* pVar = (Idx<Variable>*)lua_touserdata(L, 1);
	auto* pChild = (Idx<Variable>*)lua_touserdata(L, 2);

	(*pVar)->children.push_back(*pChild);
	return 0;
}